

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

bool __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseCDATA
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  char *c;
  char *pcVar5;
  char cVar6;
  string<char> sStack_28;
  
  pcVar2 = this->P;
  cVar1 = pcVar2[1];
  if (cVar1 == '[') {
    this->CurrentNodeType = EXN_CDATA;
    c = pcVar2;
    for (uVar3 = 0; (cVar6 = *c, cVar6 != '\0' && (uVar3 < 8)); uVar3 = uVar3 + 1) {
      c = c + 1;
      this->P = c;
    }
    if (cVar6 != '\0') {
      pcVar5 = c + -2;
      pcVar4 = (char *)0x0;
      while ((cVar6 != '\0' && (pcVar4 == (char *)0x0))) {
        if ((cVar6 == '>') && (pcVar5[1] == ']')) {
          pcVar4 = (char *)0x0;
          if (*pcVar5 == ']') {
            pcVar4 = pcVar5;
          }
        }
        else {
          pcVar4 = (char *)0x0;
        }
        this->P = pcVar5 + 3;
        cVar6 = pcVar5[3];
        pcVar5 = pcVar5 + 1;
      }
      if (pcVar4 == (char *)0x0) {
        core::string<char>::operator=(&this->NodeName,"");
      }
      else {
        core::string<char>::string<char>(&sStack_28,c,((int)pcVar4 - (int)pcVar2) - uVar3);
        core::string<char>::operator=(&this->NodeName,&sStack_28);
        core::string<char>::~string(&sStack_28);
      }
    }
  }
  return cVar1 == '[';
}

Assistant:

bool parseCDATA()
	{
		if (*(P+1) != L'[')
			return false;

		CurrentNodeType = EXN_CDATA;

		// skip '<![CDATA['
		int count=0;
		while( *P && count<8 )
		{
			++P;
			++count;
		}

		if (!*P)
			return true;

		char_type *cDataBegin = P;
		char_type *cDataEnd = 0;

		// find end of CDATA
		while(*P && !cDataEnd)
		{
			if (*P == L'>' && 
			   (*(P-1) == L']') &&
			   (*(P-2) == L']'))
			{
				cDataEnd = P - 2;
			}

			++P;
		}

		if ( cDataEnd )
			NodeName = core::string<char_type>(cDataBegin, (int)(cDataEnd - cDataBegin));
		else
			NodeName = "";

		return true;
	}